

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall t_html_generator::print_doc(t_html_generator *this,t_doc *tdoc)

{
  ostream *poVar1;
  string local_40;
  
  if (tdoc->has_doc_ == true) {
    if (this->unsafe_ == true) {
      poVar1 = std::operator<<((ostream *)&this->f_out_,(string *)&tdoc->doc_);
      std::operator<<(poVar1,"<br/>");
      return;
    }
    poVar1 = std::operator<<((ostream *)&this->f_out_,"<pre>");
    escape_html(&local_40,this,&tdoc->doc_);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    std::operator<<(poVar1,"</pre><br/>");
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void t_html_generator::print_doc(t_doc* tdoc) {
  if (tdoc->has_doc()) {
    if (unsafe_) {
      f_out_ << tdoc->get_doc() << "<br/>";
    } else {
      f_out_ << "<pre>" << escape_html(tdoc->get_doc()) << "</pre><br/>";
    }
  }
}